

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# note.c
# Opt level: O0

void notify(nsync_note n)

{
  nsync_note parent_00;
  nsync_time a;
  uint32_t uVar1;
  int iVar2;
  nsync_note parent;
  nsync_time t;
  nsync_note n_local;
  
  nsync_mu_lock(&n->note_mu);
  uVar1 = atm_load_acq_u32_(&n->notified);
  if (uVar1 == 0) {
    if (n->expiry_time_valid == 0) {
      parent = (nsync_note)0x7fffffffffffffff;
      t.tv_sec = 999999999;
    }
    else {
      parent = (nsync_note)(n->expiry_time).tv_sec;
      t.tv_sec = (n->expiry_time).tv_nsec;
    }
  }
  else {
    parent = (nsync_note)0;
    t.tv_sec = 0;
  }
  a.tv_nsec = t.tv_sec;
  a.tv_sec = (__time_t)parent;
  iVar2 = nsync_time_cmp(a,(nsync_time)ZEXT816((ulong)0));
  if (0 < iVar2) {
    n->disconnecting = n->disconnecting + 1;
    parent_00 = n->parent;
    if ((parent_00 != (nsync_note)0x0) &&
       (iVar2 = nsync_mu_trylock(&parent_00->note_mu), iVar2 == 0)) {
      nsync_mu_unlock(&n->note_mu);
      nsync_mu_lock(&parent_00->note_mu);
      nsync_mu_lock(&n->note_mu);
    }
    note_notify_child(n,parent_00);
    if (parent_00 != (nsync_note)0x0) {
      nsync_mu_unlock(&parent_00->note_mu);
    }
    n->disconnecting = n->disconnecting - 1;
  }
  nsync_mu_unlock(&n->note_mu);
  return;
}

Assistant:

static void notify (nsync_note n) {
	nsync_time t;
	nsync_mu_lock (&n->note_mu);
	t = NOTIFIED_TIME (n);
	if (nsync_time_cmp (t, nsync_time_zero) > 0) {
		nsync_note parent;
		n->disconnecting++;
		parent = n->parent;
		if (parent != NULL && !nsync_mu_trylock (&parent->note_mu)) {
			nsync_mu_unlock (&n->note_mu);
			nsync_mu_lock (&parent->note_mu);
			nsync_mu_lock (&n->note_mu);
		}
		note_notify_child (n, parent);
		if (parent != NULL) {
			nsync_mu_unlock (&parent->note_mu);
		}
		n->disconnecting--;
	}
	nsync_mu_unlock (&n->note_mu);
}